

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O3

void * asn1_type_value_as_pointer(ASN1_TYPE *a)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = a->type;
  if (iVar1 != 6) {
    if (iVar1 == 5) {
      return (void *)0x0;
    }
    if (iVar1 == 1) {
      pvVar2 = (void *)0xff;
      if ((a->value).boolean == 0) {
        pvVar2 = (void *)0x0;
      }
      return pvVar2;
    }
  }
  return (a->value).ptr;
}

Assistant:

const void *asn1_type_value_as_pointer(const ASN1_TYPE *a) {
  switch (a->type) {
    case V_ASN1_NULL:
      return NULL;
    case V_ASN1_BOOLEAN:
      return a->value.boolean ? (void *)0xff : NULL;
    case V_ASN1_OBJECT:
      return a->value.object;
    default:
      return a->value.asn1_string;
  }
}